

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flip_book_group.cpp
# Opt level: O2

void flip_book_copy(Am_Object *self)

{
  Am_Object *__s;
  ulong *puVar1;
  ulong *puVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Object_Demon *pAVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  long lVar8;
  Am_Object *pAVar9;
  Am_Object in_stack_ffffffffffffff58;
  Am_Object current_component;
  Am_Value_List components;
  Am_Object part;
  Am_Object local_70;
  ulong *local_68;
  Am_Part_Iterator parts;
  Am_Object local_50;
  Am_Value_List new_components;
  
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&components);
  pAVar5 = Am_Demon_Set::Get_Object_Demon((Am_Demon_Set *)&components,Am_COPY_OBJ);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&components);
  Am_Object::Am_Object(&local_50,self);
  (*pAVar5)(in_stack_ffffffffffffff58);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::Am_Value_List(&components);
  pAVar6 = Am_Object::Get(self,0x83,0);
  Am_Value_List::operator=(&components,pAVar6);
  Am_Value_List::Am_Value_List(&new_components);
  Am_Object::Am_Object(&local_70,self);
  Am_Part_Iterator::Am_Part_Iterator(&parts,&local_70);
  Am_Object::~Am_Object(&local_70);
  uVar4 = Am_Part_Iterator::Length(&parts);
  bVar3 = Am_Value_List::Empty(&components);
  if (uVar4 == 0 || bVar3) {
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&Am_No_Value_List);
    Am_Object::Set(self,0x83,pAVar7,0);
  }
  else {
    local_68 = (ulong *)operator_new__((ulong)uVar4 * 0x10 + 8);
    *local_68 = (ulong)((uint)uVar4 + (uint)uVar4);
    __s = (Am_Object *)(local_68 + 1);
    memset(__s,0,(ulong)uVar4 * 0x10);
    part.data = (Am_Object_Data *)0x0;
    Am_Part_Iterator::Start(&parts);
    pAVar9 = __s;
    while( true ) {
      bVar3 = Am_Part_Iterator::Last(&parts);
      if (bVar3) break;
      Am_Part_Iterator::Get((Am_Part_Iterator *)&current_component);
      Am_Object::operator=(&part,&current_component);
      Am_Object::~Am_Object(&current_component);
      Am_Object::operator=(pAVar9 + uVar4,&part);
      pAVar6 = Am_Object::Get(&part,0xc,0);
      Am_Object::operator=(pAVar9,pAVar6);
      pAVar9 = pAVar9 + 1;
      Am_Part_Iterator::Next(&parts);
    }
    current_component.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&components);
    puVar1 = local_68;
    while( true ) {
      bVar3 = Am_Value_List::Last(&components);
      puVar2 = local_68;
      if (bVar3) break;
      pAVar6 = Am_Value_List::Get(&components);
      Am_Object::operator=(&current_component,pAVar6);
      pAVar9 = __s;
      for (lVar8 = -8; (ulong)((uint)uVar4 * 8) + 8 + lVar8 != 0; lVar8 = lVar8 + -8) {
        bVar3 = Am_Object::operator==(&current_component,pAVar9);
        if (bVar3) {
          pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_
                             ((Am_Object *)((long)puVar1 + ((ulong)((uint)uVar4 * 8) - lVar8)));
          Am_Value_List::Add(&new_components,pAVar7,Am_TAIL,true);
          break;
        }
        pAVar9 = pAVar9 + 1;
      }
      Am_Value_List::Next(&components);
    }
    if (*local_68 != 0) {
      lVar8 = *local_68 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar2 + lVar8));
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    operator_delete__(puVar2);
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_components);
    Am_Object::Set(self,0x83,pAVar7,0);
    Am_Object::~Am_Object(&current_component);
    Am_Object::~Am_Object(&part);
  }
  Am_Part_Iterator::~Am_Part_Iterator(&parts);
  Am_Value_List::~Am_Value_List(&new_components);
  Am_Value_List::~Am_Value_List(&components);
  return;
}

Assistant:

static void
flip_book_copy(Am_Object self)
{
  Am_Object_Demon *copy_demon = ((Am_Object_Advanced &)Am_Aggregate)
                                    .Get_Demons()
                                    .Get_Object_Demon(Am_COPY_OBJ);
  copy_demon(self);

  Am_Value_List components;
  components = self.Get(Am_FLIP_BOOK_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = self;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    self.Set(Am_FLIP_BOOK_PARTS, Am_No_Value_List);
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        new_components.Add(part_map[i + parts_length]);
        break;
      }
  }
  delete[] part_map;
  self.Set(Am_FLIP_BOOK_PARTS, new_components);
}